

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O1

void nn_ws_handshake_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  if (type == -3 && src == -2) goto LAB_001ac4e0;
  while (*(int *)&self[1].fn != 10) {
    nn_ws_handshake_shutdown_cold_1();
LAB_001ac4e0:
    nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
    *(undefined4 *)&self[1].fn = 10;
  }
  nn_ws_handshake_shutdown_cold_2();
  return;
}

Assistant:

static void nn_ws_handshake_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ws_handshake *handshaker;

    handshaker = nn_cont (self, struct nn_ws_handshake, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_timer_stop (&handshaker->timer);
        handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING;
    }
    if (nn_slow (handshaker->state == NN_WS_HANDSHAKE_STATE_STOPPING)) {
        if (!nn_timer_isidle (&handshaker->timer))
            return;
        handshaker->state = NN_WS_HANDSHAKE_STATE_IDLE;
        nn_fsm_stopped (&handshaker->fsm, NN_WS_HANDSHAKE_STOPPED);
        return;
    }

    nn_fsm_bad_state (handshaker->state, src, type);
}